

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  ushort uVar1;
  sqlite3 *db;
  uchar *puVar2;
  sqlite3_value *pVal;
  
  uVar1 = *(ushort *)(pStmt + 0xc0);
  if ((uint)N < (uint)uVar1) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    pVal = (sqlite3_value *)((ulong)((uint)uVar1 * useType + N) * 0x38 + *(long *)(pStmt + 0x98));
    if (useUtf16 == 0) {
      puVar2 = sqlite3_value_text(pVal);
    }
    else {
      puVar2 = (uchar *)sqlite3_value_text16(pVal);
    }
    if (db->mallocFailed != '\0') {
      sqlite3OomClear(db);
      puVar2 = (uchar *)0x0;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    puVar2 = (uchar *)0x0;
  }
  return puVar2;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}